

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O1

double __thiscall TasGrid::RuleWavelet::getWeight(RuleWavelet *this,int point)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (this->order == 3) {
    if ((uint)point < 5) {
      dVar1 = *(double *)(&DAT_001d1d78 + (ulong)(uint)point * 8);
    }
  }
  else if (this->order == 1) {
    if (point < 3) {
      dVar1 = 0.5;
    }
    if (point == 0) {
      return 1.0;
    }
  }
  return dVar1;
}

Assistant:

double RuleWavelet::getWeight(int point) const{
    // Returns the integral of the given wavelet.
    if (order == 1){
        return (point == 0) ? 1.0 : (point <= 2) ? 0.5 : 0.0;
    }else if(order == 3){
        if (point > 4){
            return 0.0;
        }
        switch (point){
        case 1:
        case 2:
            return 1.680555555555555691e-01;
        case 3:
        case 4:
            return 6.611111111111110938e-01;
        case 0:
            return 3.416666666666666741e-01;
        }
    }
    return 0.0;
}